

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::CheckOpcode3
          (TypeChecker *this,Opcode opcode,Limits *limits1,Limits *limits2,Limits *limits3)

{
  Result RVar1;
  Type expected2;
  Type expected1;
  Opcode local_7c;
  Info local_78;
  
  local_7c.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_78,&local_7c);
  expected1 = local_78.param_types[0];
  if (limits1 != (Limits *)0x0) {
    expected1 = (Type)~(ulong)limits1->is_64;
  }
  Opcode::GetInfo(&local_78,&local_7c);
  expected2 = local_78.param_types[1];
  if (limits2 != (Limits *)0x0) {
    expected2 = (Type)~(ulong)limits2->is_64;
  }
  Opcode::GetInfo(&local_78,&local_7c);
  if (limits3 != (Limits *)0x0) {
    local_78.param_types[2] = (Type)~(ulong)limits3->is_64;
  }
  Opcode::GetInfo(&local_78,&local_7c);
  RVar1 = PopAndCheck3Types(this,expected1,expected2,local_78.param_types[2],local_78.name);
  Opcode::GetInfo(&local_78,&local_7c);
  PushType(this,local_78.result_type);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode3(Opcode opcode,
                                 const Limits* limits1,
                                 const Limits* limits2,
                                 const Limits* limits3) {
  Result result = PopAndCheck3Types(
      GetMemoryParam(opcode.GetParamType1(), limits1),
      GetMemoryParam(opcode.GetParamType2(), limits2),
      GetMemoryParam(opcode.GetParamType3(), limits3), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}